

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O1

int CVAhermiteGetY(CVodeMem cv_mem,sunrealtype t,N_Vector y,N_Vector *yS)

{
  CVadjMemRec *pCVar1;
  CVdtpntMemRec **ppCVar2;
  undefined8 *puVar3;
  sunrealtype *psVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  int iVar10;
  long lVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar17;
  double dVar18;
  int iVar19;
  int newpoint;
  long indx;
  undefined8 local_100;
  int local_f4;
  double local_f0;
  double local_e8;
  N_Vector local_e0;
  double local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  sunrealtype local_b8;
  long local_b0 [2];
  double dStack_a0;
  double local_98;
  double local_90;
  double local_88;
  ulong uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  N_Vector *local_68;
  N_Vector *pp_Stack_60;
  undefined8 local_58;
  undefined8 local_50;
  N_Vector local_48;
  N_Vector p_Stack_40;
  long lVar16;
  
  pCVar1 = cv_mem->cv_adj_mem;
  uVar12 = 0;
  if ((yS != (N_Vector *)0x0) && (uVar12 = 0, pCVar1->ca_IMinterpSensi != 0)) {
    uVar12 = cv_mem->cv_Ns;
  }
  ppCVar2 = pCVar1->dt_mem;
  local_e0 = y;
  local_b8 = t;
  iVar10 = CVAfindIndex(cv_mem,t,local_b0,&local_f4);
  if (iVar10 != 0) {
    return iVar10;
  }
  if (local_b0[0] == 0) {
    puVar3 = (undefined8 *)(*ppCVar2)->content;
    N_VScale(0x3ff0000000000000,*puVar3,local_e0);
    auVar9 = _DAT_00138040;
    if ((int)uVar12 < 1) {
      return 0;
    }
    psVar4 = cv_mem->cv_cvals;
    lVar11 = (ulong)uVar12 - 1;
    auVar14._8_4_ = (int)lVar11;
    auVar14._0_8_ = lVar11;
    auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar11 = 0;
    auVar14 = auVar14 ^ _DAT_00138040;
    auVar15 = _DAT_00138030;
    do {
      bVar8 = auVar14._0_4_ < SUB164(auVar15 ^ auVar9,0);
      iVar10 = auVar14._4_4_;
      iVar19 = SUB164(auVar15 ^ auVar9,4);
      if ((bool)(~(iVar10 < iVar19 || iVar19 == iVar10 && bVar8) & 1)) {
        *(undefined8 *)((long)psVar4 + lVar11) = 0x3ff0000000000000;
      }
      if (iVar10 >= iVar19 && (iVar19 != iVar10 || !bVar8)) {
        *(undefined8 *)((long)psVar4 + lVar11 + 8) = 0x3ff0000000000000;
      }
      lVar16 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar16 + 2;
      lVar11 = lVar11 + 0x10;
    } while ((ulong)(uVar12 + 1 >> 1) << 4 != lVar11);
    iVar10 = N_VScaleVectorArray(uVar12,cv_mem->cv_cvals,puVar3[2],yS);
  }
  else {
    dVar18 = ppCVar2[local_b0[0] + -1]->t;
    dVar17 = ppCVar2[local_b0[0]]->t;
    puVar3 = (undefined8 *)ppCVar2[local_b0[0] + -1]->content;
    if (pCVar1->ca_IMinterpSensi == 0) {
      uVar13 = 0;
      local_100 = 0;
    }
    else {
      local_100 = puVar3[2];
      uVar13 = puVar3[3];
    }
    local_98 = dVar17 - dVar18;
    uVar5 = *puVar3;
    uVar6 = puVar3[1];
    local_90 = local_98;
    if (local_f4 != 0) {
      puVar3 = (undefined8 *)ppCVar2[local_b0[0]]->content;
      uVar7 = *puVar3;
      local_48 = (N_Vector)puVar3[1];
      local_b0[1] = 0xc000000000000000;
      dStack_a0 = 2.0;
      uStack_d0 = 0;
      local_f0 = dVar18;
      local_e8 = dVar17;
      local_d8 = local_98;
      local_c0 = uVar13;
      local_58 = uVar7;
      local_50 = uVar5;
      p_Stack_40 = (N_Vector)uVar6;
      iVar10 = N_VLinearCombination(4,local_b0 + 1,&local_58,pCVar1->ca_Y[1]);
      if (iVar10 != 0) {
        return -0x1c;
      }
      local_b0[1] = 0x3ff0000000000000;
      dStack_a0 = -1.0;
      local_98 = -local_d8;
      uStack_80 = uStack_d0 ^ 0x8000000000000000;
      local_88 = local_98;
      local_58 = uVar7;
      local_50 = uVar5;
      local_48 = (N_Vector)uVar6;
      iVar10 = N_VLinearCombination(3,local_b0 + 1,&local_58,pCVar1->ca_Y[0]);
      uVar13 = local_c0;
      if (iVar10 != 0) {
        return -0x1c;
      }
      dVar18 = local_f0;
      dVar17 = local_e8;
      local_90 = local_d8;
      if (0 < (int)uVar12) {
        local_c8 = puVar3[2];
        local_68 = (N_Vector *)puVar3[3];
        local_b0[1] = 0xc000000000000000;
        dStack_a0 = 2.0;
        local_70 = local_100;
        local_98 = local_d8;
        pp_Stack_60 = (N_Vector *)local_c0;
        local_78 = local_c8;
        iVar10 = N_VLinearCombinationVectorArray(uVar12,4,local_b0 + 1,&local_78,pCVar1->ca_YS[1]);
        if (iVar10 != 0) {
          return -0x1c;
        }
        local_78 = local_c8;
        local_b0[1] = 0x3ff0000000000000;
        dStack_a0 = -1.0;
        local_70 = local_100;
        local_98 = local_88;
        local_68 = (N_Vector *)uVar13;
        iVar10 = N_VLinearCombinationVectorArray(uVar12,3,local_b0 + 1,&local_78,pCVar1->ca_YS[0]);
        dVar18 = local_f0;
        dVar17 = local_e8;
        local_90 = local_d8;
        if (iVar10 != 0) {
          return -0x1c;
        }
      }
    }
    dStack_a0 = local_b8 - dVar18;
    local_b0[1] = 0x3ff0000000000000;
    local_98 = (dStack_a0 / local_90) * (dStack_a0 / local_90);
    local_90 = ((local_b8 - dVar17) * local_98) / local_90;
    local_48 = pCVar1->ca_Y[0];
    p_Stack_40 = pCVar1->ca_Y[1];
    local_58 = uVar5;
    local_50 = uVar6;
    iVar10 = N_VLinearCombination(4,local_b0 + 1,&local_58,local_e0);
    if (iVar10 != 0) {
      return -0x1c;
    }
    if ((int)uVar12 < 1) {
      return 0;
    }
    local_78 = local_100;
    local_68 = pCVar1->ca_YS[0];
    pp_Stack_60 = pCVar1->ca_YS[1];
    local_70 = uVar13;
    iVar10 = N_VLinearCombinationVectorArray(uVar12,4,local_b0 + 1,&local_78,yS);
  }
  if (iVar10 == 0) {
    return 0;
  }
  return -0x1c;
}

Assistant:

static int CVAhermiteGetY(CVodeMem cv_mem, sunrealtype t, N_Vector y, N_Vector* yS)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVhermiteDataMem content0, content1;

  sunrealtype t0, t1, delta;
  sunrealtype factor1, factor2, factor3;

  N_Vector y0, yd0, y1, yd1;
  N_Vector *yS0 = NULL, *ySd0 = NULL, *yS1, *ySd1;

  int flag, is, NS;
  long int indx;
  sunbooleantype newpoint;

  /* local variables for fused vector oerations */
  int retval;
  sunrealtype cvals[4];
  N_Vector Xvecs[4];
  N_Vector* XXvecs[4];

  ca_mem = cv_mem->cv_adj_mem;
  dt_mem = ca_mem->dt_mem;

  /* Local value of Ns */

  NS = (ca_mem->ca_IMinterpSensi && (yS != NULL)) ? cv_mem->cv_Ns : 0;

  /* Get the index in dt_mem */

  flag = CVAfindIndex(cv_mem, t, &indx, &newpoint);
  if (flag != CV_SUCCESS) { return (flag); }

  /* If we are beyond the left limit but close enough,
     then return y at the left limit. */

  if (indx == 0)
  {
    content0 = (CVhermiteDataMem)(dt_mem[0]->content);
    N_VScale(ONE, content0->y, y);

    if (NS > 0)
    {
      for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }

      retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content0->yS, yS);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }

    return (CV_SUCCESS);
  }

  /* Extract stuff from the appropriate data points */

  t0    = dt_mem[indx - 1]->t;
  t1    = dt_mem[indx]->t;
  delta = t1 - t0;

  content0 = (CVhermiteDataMem)(dt_mem[indx - 1]->content);
  y0       = content0->y;
  yd0      = content0->yd;
  if (ca_mem->ca_IMinterpSensi)
  {
    yS0  = content0->yS;
    ySd0 = content0->ySd;
  }

  if (newpoint)
  {
    /* Recompute Y0 and Y1 */

    content1 = (CVhermiteDataMem)(dt_mem[indx]->content);

    y1  = content1->y;
    yd1 = content1->yd;

    /* Y1 = delta (yd1 + yd0) - 2 (y1 - y0) */
    cvals[0] = -TWO;
    Xvecs[0] = y1;
    cvals[1] = TWO;
    Xvecs[1] = y0;
    cvals[2] = delta;
    Xvecs[2] = yd1;
    cvals[3] = delta;
    Xvecs[3] = yd0;

    retval = N_VLinearCombination(4, cvals, Xvecs, ca_mem->ca_Y[1]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

    /* Y0 = y1 - y0 - delta * yd0 */
    cvals[0] = ONE;
    Xvecs[0] = y1;
    cvals[1] = -ONE;
    Xvecs[1] = y0;
    cvals[2] = -delta;
    Xvecs[2] = yd0;

    retval = N_VLinearCombination(3, cvals, Xvecs, ca_mem->ca_Y[0]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

    /* Recompute YS0 and YS1, if needed */

    if (NS > 0)
    {
      yS1  = content1->yS;
      ySd1 = content1->ySd;

      /* YS1 = delta (ySd1 + ySd0) - 2 (yS1 - yS0) */
      cvals[0]  = -TWO;
      XXvecs[0] = yS1;
      cvals[1]  = TWO;
      XXvecs[1] = yS0;
      cvals[2]  = delta;
      XXvecs[2] = ySd1;
      cvals[3]  = delta;
      XXvecs[3] = ySd0;

      retval = N_VLinearCombinationVectorArray(NS, 4, cvals, XXvecs,
                                               ca_mem->ca_YS[1]);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

      /* YS0 = yS1 - yS0 - delta * ySd0 */
      cvals[0]  = ONE;
      XXvecs[0] = yS1;
      cvals[1]  = -ONE;
      XXvecs[1] = yS0;
      cvals[2]  = -delta;
      XXvecs[2] = ySd0;

      retval = N_VLinearCombinationVectorArray(NS, 3, cvals, XXvecs,
                                               ca_mem->ca_YS[0]);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }
  }

  /* Perform the actual interpolation. */

  factor1 = t - t0;

  factor2 = factor1 / delta;
  factor2 = factor2 * factor2;

  factor3 = factor2 * (t - t1) / delta;

  cvals[0] = ONE;
  cvals[1] = factor1;
  cvals[2] = factor2;
  cvals[3] = factor3;

  /* y = y0 + factor1 yd0 + factor2 * Y[0] + factor3 Y[1] */
  Xvecs[0] = y0;
  Xvecs[1] = yd0;
  Xvecs[2] = ca_mem->ca_Y[0];
  Xvecs[3] = ca_mem->ca_Y[1];

  retval = N_VLinearCombination(4, cvals, Xvecs, y);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  /* yS = yS0 + factor1 ySd0 + factor2 * YS[0] + factor3 YS[1], if needed */
  if (NS > 0)
  {
    XXvecs[0] = yS0;
    XXvecs[1] = ySd0;
    XXvecs[2] = ca_mem->ca_YS[0];
    XXvecs[3] = ca_mem->ca_YS[1];

    retval = N_VLinearCombinationVectorArray(NS, 4, cvals, XXvecs, yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  return (CV_SUCCESS);
}